

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

int lj_cf_ffi_new(lua_State *L)

{
  CTInfo CVar1;
  CTSize CVar2;
  GCcdata *pGVar3;
  cTValue *pcVar4;
  GCtab *t_00;
  ulong uVar5;
  lua_State *in_RDI;
  GCtab *t;
  cTValue *tv;
  GCcdata *cd;
  TValue *o;
  CTInfo info;
  CTSize sz;
  CType *ct;
  CTypeID id;
  CTState *cts;
  CTState *cts_1;
  CType *ct_1;
  GCobj *o_1;
  GCstr *in_stack_fffffffffffffe68;
  CTypeID id_00;
  TValue *in_stack_fffffffffffffe70;
  MMS mm;
  cTValue *in_stack_fffffffffffffe78;
  undefined8 in_stack_fffffffffffffe80;
  CTState *cts_00;
  cTValue *in_stack_fffffffffffffe88;
  CTState *in_stack_fffffffffffffe90;
  TValue *local_158;
  CTSize local_14c;
  cTValue *local_148;
  CTypeID local_13c;
  CTState *local_138;
  lua_State *local_130;
  CTState *local_128;
  cTValue *local_118;
  TValue *local_110;
  TValue *in_stack_fffffffffffffef8;
  CTState *in_stack_ffffffffffffff00;
  lua_State *in_stack_ffffffffffffff08;
  cTValue *local_e8;
  
  CVar2 = (CTSize)((ulong)in_stack_fffffffffffffe80 >> 0x20);
  local_138 = (CTState *)(ulong)*(uint *)((ulong)(in_RDI->glref).ptr32 + 0x194);
  local_138->L = in_RDI;
  local_130 = in_RDI;
  local_128 = local_138;
  local_13c = ffi_checkctype(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                             in_stack_fffffffffffffef8);
  for (local_e8 = (cTValue *)(local_138->tab + local_13c); (local_e8->u32).lo >> 0x1c == 8;
      local_e8 = (cTValue *)(local_138->tab + ((local_e8->u32).lo & 0xffff))) {
  }
  local_148 = local_e8;
  CVar1 = lj_ctype_info(local_138,local_13c,&local_14c);
  local_158 = local_130->base + 1;
  if ((CVar1 & 0x100000) != 0) {
    local_158 = local_130->base + 2;
    cts_00 = local_138;
    in_stack_fffffffffffffe88 = local_148;
    CVar2 = ffi_checkint((lua_State *)local_138,(int)((ulong)in_stack_fffffffffffffe78 >> 0x20));
    local_14c = lj_ctype_vlsize(cts_00,(CType *)&in_stack_fffffffffffffe88->field_2,CVar2);
    CVar2 = (CTSize)((ulong)cts_00 >> 0x20);
  }
  id_00 = (CTypeID)((ulong)in_stack_fffffffffffffe68 >> 0x20);
  if (local_14c != 0xffffffff) {
    pGVar3 = lj_cdata_newx((CTState *)&in_stack_fffffffffffffe70->field_2,id_00,
                           (ErrMsg)in_stack_fffffffffffffe68,0);
    local_158[-1].u32.lo = (uint32_t)pGVar3;
    *(undefined4 *)((long)local_158 + -4) = 0xfffffff5;
    lj_cconv_ct_init(in_stack_fffffffffffffe90,(CType *)&in_stack_fffffffffffffe88->field_2,CVar2,
                     (uint8_t *)&in_stack_fffffffffffffe78->u64,in_stack_fffffffffffffe70,
                     (MSize)((ulong)in_stack_fffffffffffffe68 >> 0x20));
    mm = (MMS)((ulong)in_stack_fffffffffffffe70 >> 0x20);
    if ((((local_148->u32).lo >> 0x1c == 1) &&
        (pcVar4 = lj_tab_getinth(local_138->miscmap,-local_13c), pcVar4 != (cTValue *)0x0)) &&
       ((pcVar4->field_2).it == 0xfffffff4)) {
      if ((pcVar4->u32).lo == 0) {
        in_stack_fffffffffffffe78 = (cTValue *)0x0;
      }
      else if ((*(byte *)((ulong)(pcVar4->u32).lo + 6) & 4) == 0) {
        in_stack_fffffffffffffe78 =
             lj_meta_cache((GCtab *)&in_stack_fffffffffffffe78->field_2,mm,in_stack_fffffffffffffe68
                          );
      }
      else {
        in_stack_fffffffffffffe78 = (cTValue *)0x0;
      }
      if ((in_stack_fffffffffffffe78 != (cTValue *)0x0) &&
         (t_00 = (GCtab *)(ulong)*(uint *)((ulong)(local_130->glref).ptr32 + 0x230),
         (t_00->metatable).gcptr32 != 0)) {
        pcVar4 = in_stack_fffffffffffffe78;
        local_110 = lj_tab_set((lua_State *)&in_stack_fffffffffffffe78->field_2,t_00,
                               in_stack_fffffffffffffe88);
        local_110->field_2 = *(anon_struct_8_2_fd66bcdd_for_TValue_2 *)pcVar4;
        if ((t_00->marked & 4) != 0) {
          uVar5 = (ulong)(local_130->glref).ptr32;
          t_00->marked = t_00->marked & 0xfb;
          (t_00->gclist).gcptr32 = *(uint32_t *)(uVar5 + 0x6c);
          *(int *)(uVar5 + 0x6c) = (int)t_00;
        }
        pGVar3->marked = pGVar3->marked | 0x10;
        local_118 = pcVar4;
      }
    }
    local_130->top = local_158;
    if (*(uint *)((ulong)(local_130->glref).ptr32 + 0x54) <=
        *(uint *)((ulong)(local_130->glref).ptr32 + 0x50)) {
      lj_gc_step((lua_State *)&in_stack_fffffffffffffe78->field_2);
    }
    return 1;
  }
  lj_err_arg((lua_State *)&in_stack_fffffffffffffe70->field_2,id_00,
             (ErrMsg)in_stack_fffffffffffffe68);
}

Assistant:

LJLIB_CF(ffi_new)	LJLIB_REC(.)
{
  CTState *cts = ctype_cts(L);
  CTypeID id = ffi_checkctype(L, cts, NULL);
  CType *ct = ctype_raw(cts, id);
  CTSize sz;
  CTInfo info = lj_ctype_info(cts, id, &sz);
  TValue *o = L->base+1;
  GCcdata *cd;
  if ((info & CTF_VLA)) {
    o++;
    sz = lj_ctype_vlsize(cts, ct, (CTSize)ffi_checkint(L, 2));
  }
  if (sz == CTSIZE_INVALID)
    lj_err_arg(L, 1, LJ_ERR_FFI_INVSIZE);
  cd = lj_cdata_newx(cts, id, sz, info);
  setcdataV(L, o-1, cd);  /* Anchor the uninitialized cdata. */
  lj_cconv_ct_init(cts, ct, sz, cdataptr(cd),
		   o, (MSize)(L->top - o));  /* Initialize cdata. */
  if (ctype_isstruct(ct->info)) {
    /* Handle ctype __gc metamethod. Use the fast lookup here. */
    cTValue *tv = lj_tab_getinth(cts->miscmap, -(int32_t)id);
    if (tv && tvistab(tv) && (tv = lj_meta_fast(L, tabV(tv), MM_gc))) {
      GCtab *t = tabref(G(L)->gcroot[GCROOT_FFI_FIN]);
      if (gcref(t->metatable)) {
	/* Add to finalizer table, if still enabled. */
	copyTV(L, lj_tab_set(L, t, o-1), tv);
	lj_gc_anybarriert(L, t);
	cd->marked |= LJ_GC_CDATA_FIN;
      }
    }
  }
  L->top = o;  /* Only return the cdata itself. */
  lj_gc_check(L);
  return 1;
}